

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O3

string * findMatchingHeader(string *__return_storage_ptr__,string *absPath,string *mocSubDir,
                           string *basename,
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *headerExtensions)

{
  bool bVar1;
  long *plVar2;
  string *extraout_RAX;
  long *plVar3;
  string *psVar4;
  size_type *psVar5;
  pointer pbVar6;
  string sourceFilePath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  long local_80;
  long lStack_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  string *local_68;
  string *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_60 = (string *)&__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_60;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pbVar6 = (headerExtensions->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar6 != (headerExtensions->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_60;
    local_68 = __return_storage_ptr__;
    local_60 = (string *)headerExtensions;
    local_58 = absPath;
    do {
      std::operator+(&local_d0,local_58,basename);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_80 = *plVar3;
        lStack_78 = plVar2[3];
        local_90._M_allocated_capacity = (size_type)&local_80;
      }
      else {
        local_80 = *plVar3;
        local_90._M_allocated_capacity = (size_type)(long *)*plVar2;
      }
      local_90._8_8_ = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::_M_append
                                 (local_a0 + 0x10,(ulong)(pbVar6->_M_dataplus)._M_p);
      local_b0 = (string *)local_a0;
      psVar4 = (string *)(plVar2 + 2);
      if ((string *)*plVar2 == psVar4) {
        local_a0._0_8_ = (psVar4->_M_dataplus)._M_p;
        local_a0._8_8_ = plVar2[3];
      }
      else {
        local_a0._0_8_ = (psVar4->_M_dataplus)._M_p;
        local_b0 = (string *)*plVar2;
      }
      local_a8 = plVar2[1];
      *plVar2 = (long)psVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      if ((long *)local_90._M_allocated_capacity != &local_80) {
        operator_delete((void *)local_90._M_allocated_capacity,local_80 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      bVar1 = cmsys::SystemTools::FileExists((char *)local_b0);
      if (bVar1) {
LAB_0026bca2:
        std::__cxx11::string::_M_assign((string *)local_68);
        if (local_b0 == (string *)local_a0) {
          return (string *)local_a0;
        }
        operator_delete(local_b0,(ulong)(local_a0._0_8_ + 1));
        return extraout_RAX;
      }
      if (mocSubDir->_M_string_length != 0) {
        std::operator+(&local_50,mocSubDir,basename);
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        psVar5 = (size_type *)(plVar2 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_d0.field_2._M_allocated_capacity = *psVar5;
          local_d0.field_2._8_8_ = plVar2[3];
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar5;
          local_d0._M_dataplus._M_p = (pointer)*plVar2;
        }
        local_d0._M_string_length = plVar2[1];
        *plVar2 = (long)psVar5;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_d0,(ulong)(pbVar6->_M_dataplus)._M_p);
        plVar3 = plVar2 + 2;
        if ((long *)*plVar2 == plVar3) {
          local_80 = *plVar3;
          lStack_78 = plVar2[3];
          local_90._M_allocated_capacity = (size_type)&local_80;
        }
        else {
          local_80 = *plVar3;
          local_90._M_allocated_capacity = (size_type)(long *)*plVar2;
        }
        local_90._8_8_ = plVar2[1];
        *plVar2 = (long)plVar3;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_b0,(string *)(local_a0 + 0x10));
        if ((long *)local_90._M_allocated_capacity != &local_80) {
          operator_delete((void *)local_90._M_allocated_capacity,local_80 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        bVar1 = cmsys::SystemTools::FileExists((char *)local_b0);
        if (bVar1) goto LAB_0026bca2;
      }
      if (local_b0 != (string *)local_a0) {
        operator_delete(local_b0,(ulong)(local_a0._0_8_ + 1));
      }
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != (pointer)local_60->_M_string_length);
  }
  return local_60;
}

Assistant:

static std::string findMatchingHeader(const std::string& absPath,
                                      const std::string& mocSubDir,
                                      const std::string& basename,
                              const std::vector<std::string>& headerExtensions)
{
  std::string header;
  for(std::vector<std::string>::const_iterator ext = headerExtensions.begin();
      ext != headerExtensions.end();
      ++ext)
    {
    std::string sourceFilePath = absPath + basename + "." + (*ext);
    if (cmsys::SystemTools::FileExists(sourceFilePath.c_str()))
      {
      header = sourceFilePath;
      break;
      }
    if (!mocSubDir.empty())
      {
      sourceFilePath = mocSubDir + basename + "." + (*ext);
      if (cmsys::SystemTools::FileExists(sourceFilePath.c_str()))
        {
        header = sourceFilePath;
        break;
        }
      }
    }

  return header;
}